

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,handle src,bool param_2)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  PyObject *ptr;
  ulong uVar5;
  allocator local_89;
  string local_88 [32];
  ulong local_68;
  size_t length;
  CharT *buffer;
  handle local_48;
  handle local_40;
  object utfNbytes;
  handle local_30;
  handle load_src;
  bool param_2_local;
  string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_local;
  handle src_local;
  
  local_30.m_ptr = src.m_ptr;
  load_src.m_ptr._7_1_ = param_2;
  this_local = (string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                *)src.m_ptr;
  bVar2 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar2) {
    ppPVar4 = handle::ptr(&local_30);
    iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x10000000);
    if (iVar3 == 0) {
      utfNbytes.super_handle.m_ptr = (handle)(handle)local_30.m_ptr;
      src_local.m_ptr._7_1_ =
           load_bytes<char>(this,(enable_if_t<std::is_same<char,_char>::value,_handle>)
                                 local_30.m_ptr);
    }
    else {
      ppPVar4 = handle::ptr(&local_30);
      ptr = (PyObject *)PyUnicode_AsEncodedString(*ppPVar4,"utf-8",0);
      handle::handle(&local_48,ptr);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_40,local_48);
      bVar2 = handle::operator_cast_to_bool(&local_40);
      if (bVar2) {
        ppPVar4 = handle::ptr(&local_40);
        length = PyBytes_AsString(*ppPVar4);
        ppPVar4 = handle::ptr(&local_40);
        uVar5 = PyBytes_Size(*ppPVar4);
        sVar1 = length;
        local_68 = uVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,(char *)sVar1,uVar5,&local_89);
        std::__cxx11::string::operator=((string *)this,local_88);
        std::__cxx11::string::~string(local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
      }
      else {
        PyErr_Clear();
      }
      buffer._0_4_ = 1;
      src_local.m_ptr._7_1_ = bVar2;
      object::~object((object *)&local_40);
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool) {
#if PY_MAJOR_VERSION < 3
        object temp;
#endif
        handle load_src = src;
        if (!src) {
            return false;
        }
        if (!PyUnicode_Check(load_src.ptr())) {
#if PY_MAJOR_VERSION >= 3
            return load_bytes(load_src);
#else
            if (std::is_same<CharT, char>::value) {
                return load_bytes(load_src);
            }

            // The below is a guaranteed failure in Python 3 when PyUnicode_Check returns false
            if (!PYBIND11_BYTES_CHECK(load_src.ptr()))
                return false;

            temp = reinterpret_steal<object>(PyUnicode_FromObject(load_src.ptr()));
            if (!temp) { PyErr_Clear(); return false; }
            load_src = temp;
#endif
        }

        auto utfNbytes = reinterpret_steal<object>(PyUnicode_AsEncodedString(
            load_src.ptr(), UTF_N == 8 ? "utf-8" : UTF_N == 16 ? "utf-16" : "utf-32", nullptr));
        if (!utfNbytes) { PyErr_Clear(); return false; }

        const auto *buffer = reinterpret_cast<const CharT *>(PYBIND11_BYTES_AS_STRING(utfNbytes.ptr()));
        size_t length = (size_t) PYBIND11_BYTES_SIZE(utfNbytes.ptr()) / sizeof(CharT);
        if (UTF_N > 8) { buffer++; length--; } // Skip BOM for UTF-16/32
        value = StringType(buffer, length);

        // If we're loading a string_view we need to keep the encoded Python object alive:
        if (IsView)
            loader_life_support::add_patient(utfNbytes);

        return true;
    }